

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::GeneratedCodeInfo::Clear(GeneratedCodeInfo *this)

{
  uint32_t cached_has_bits;
  GeneratedCodeInfo *this_local;
  
  RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::Clear
            (&(this->field_0)._impl_.annotation_);
  internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void GeneratedCodeInfo::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.GeneratedCodeInfo)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.annotation_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}